

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dof_demo.cc
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  pointer argv_00;
  options_description_easy_init *poVar1;
  typed_value<int,_char> *ptVar2;
  size_type sVar3;
  ostream *poVar4;
  variable_value *pvVar5;
  uint *puVar6;
  element_type *mesh;
  allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> local_47e;
  less<lf::base::RefEl> local_47d;
  RefEl local_47c;
  RefEl local_47b;
  RefEl local_47a;
  RefEl local_479;
  pair<const_lf::base::RefEl,_unsigned_int> local_478;
  pair<const_lf::base::RefEl,_unsigned_int> local_470;
  pair<const_lf::base::RefEl,_unsigned_int> local_468;
  pair<const_lf::base::RefEl,_unsigned_int> local_460;
  iterator local_458;
  size_type local_450;
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_448;
  shared_ptr<const_lf::mesh::Mesh> local_418;
  undefined1 local_408 [8];
  UniformFEDofHandler dof_handler;
  shared_ptr<lf::mesh::Mesh> mesh_p;
  string local_338;
  allocator<char> local_311;
  key_type local_310;
  uint local_2f0;
  allocator<char> local_2e9;
  size_type ndof_quad;
  allocator<char> local_2c1;
  key_type local_2c0;
  uint local_2a0;
  allocator<char> local_299;
  size_type ndof_tria;
  allocator<char> local_271;
  key_type local_270;
  uint local_250;
  allocator<char> local_249;
  size_type ndof_edge;
  allocator<char> local_221;
  key_type local_220;
  uint local_200;
  allocator<char> local_1f9;
  size_type ndof_node;
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1d8;
  basic_parsed_options<char> local_1b0;
  undefined1 local_188 [8];
  variables_map vm;
  int local_e0;
  int local_dc;
  options_description_easy_init local_d8 [3];
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  options_description desc;
  char **argv_local;
  int argc_local;
  
  desc.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Allowed options",&local_b9);
  boost::program_options::options_description::options_description
            ((options_description *)local_98,&local_b8,0x50,0x28);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options
                          ((options_description *)local_98);
  poVar1 = boost::program_options::options_description_easy_init::operator()
                     (local_d8,"help,h",
                      "--ndof_node <N> --ndof_edge <N> --ndof_tria <N> --ndof_quad <N>");
  ptVar2 = boost::program_options::value<int>();
  local_dc = 1;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar2,&stack0xffffffffffffff24);
  poVar1 = boost::program_options::options_description_easy_init::operator()
                     (poVar1,"ndof_node,n",(value_semantic *)ptVar2,"No of dofs on nodes");
  ptVar2 = boost::program_options::value<int>();
  local_e0 = 2;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar2,&stack0xffffffffffffff20);
  poVar1 = boost::program_options::options_description_easy_init::operator()
                     (poVar1,"ndof_edge,e",(value_semantic *)ptVar2,"No of dofs on edges");
  ptVar2 = boost::program_options::value<int>();
  vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar2,(int *)((long)&vm.m_required._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count + 4));
  poVar1 = boost::program_options::options_description_easy_init::operator()
                     (poVar1,"ndof_tria,t",(value_semantic *)ptVar2,"No of dofs on triangles");
  ptVar2 = boost::program_options::value<int>();
  vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar2,(int *)&vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  boost::program_options::options_description_easy_init::operator()
            (poVar1,"ndof_quad,q",(value_semantic *)ptVar2,"Mp of dofs on quadrilaterals");
  boost::program_options::variables_map::variables_map((variables_map *)local_188);
  argv_00 = desc.groups.
            super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1d8.super_function_base.functor._8_8_ = 0;
  local_1d8.super_function_base.functor._16_8_ = 0;
  local_1d8.super_function_base.vtable = (vtable_base *)0x0;
  local_1d8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function_n(&local_1d8);
  boost::program_options::parse_command_line<char>
            (&local_1b0,argc,(char **)argv_00,(options_description *)local_98,0,&local_1d8);
  boost::program_options::store(&local_1b0,(variables_map *)local_188,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1b0);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ndof_node,"help",&local_1f9);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&vm.super_abstract_variables_map.m_next,(key_type *)&ndof_node);
  std::__cxx11::string::~string((string *)&ndof_node);
  std::allocator<char>::~allocator(&local_1f9);
  if (sVar3 == 0) {
    local_200 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"ndof_node",&local_221);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)&vm.super_abstract_variables_map.m_next,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    if (sVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ndof_edge,"ndof_node",&local_249);
      pvVar5 = boost::program_options::variables_map::operator[]
                         ((variables_map *)local_188,(string *)&ndof_edge);
      puVar6 = (uint *)boost::program_options::variable_value::as<int>(pvVar5);
      local_200 = *puVar6;
      std::__cxx11::string::~string((string *)&ndof_edge);
      std::allocator<char>::~allocator(&local_249);
    }
    local_250 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"ndof_edge",&local_271);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)&vm.super_abstract_variables_map.m_next,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    if (sVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ndof_tria,"ndof_edge",&local_299);
      pvVar5 = boost::program_options::variables_map::operator[]
                         ((variables_map *)local_188,(string *)&ndof_tria);
      puVar6 = (uint *)boost::program_options::variable_value::as<int>(pvVar5);
      local_250 = *puVar6;
      std::__cxx11::string::~string((string *)&ndof_tria);
      std::allocator<char>::~allocator(&local_299);
    }
    local_2a0 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"ndof_tria",&local_2c1);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)&vm.super_abstract_variables_map.m_next,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    if (sVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ndof_quad,"ndof_tria",&local_2e9);
      pvVar5 = boost::program_options::variables_map::operator[]
                         ((variables_map *)local_188,(string *)&ndof_quad);
      puVar6 = (uint *)boost::program_options::variable_value::as<int>(pvVar5);
      local_2a0 = *puVar6;
      std::__cxx11::string::~string((string *)&ndof_quad);
      std::allocator<char>::~allocator(&local_2e9);
    }
    local_2f0 = 4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"ndof_quad",&local_311);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)&vm.super_abstract_variables_map.m_next,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    if (sVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"ndof_quad",
                 (allocator<char> *)
                 ((long)&mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      pvVar5 = boost::program_options::variables_map::operator[]
                         ((variables_map *)local_188,&local_338);
      puVar6 = (uint *)boost::program_options::variable_value::as<int>(pvVar5);
      local_2f0 = *puVar6;
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "LehrFEM++ demo: assignment of global shape functions");
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&std::cout,"#dof/vertex = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_200);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&std::cout,"#dof/edge = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_250);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&std::cout,"#dof/triangle = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a0);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&std::cout,"#dof/quadrilateral = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2f0);
    std::operator<<(poVar4,'\n');
    lf::mesh::test_utils::GenerateHybrid2DTestMesh
              ((test_utils *)&dof_handler.num_loc_dof_quad_,2,1.0);
    mesh = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&dof_handler.num_loc_dof_quad_);
    lf::mesh::utils::PrintInfo((ostream *)&std::cout,mesh,0xb);
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)&local_418,
               (shared_ptr<lf::mesh::Mesh> *)&dof_handler.num_loc_dof_quad_);
    local_479 = lf::base::RefEl::kPoint();
    std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
              (&local_478,&local_479,&local_200);
    local_47a = lf::base::RefEl::kSegment();
    std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
              (&local_470,&local_47a,&local_250);
    local_47b = lf::base::RefEl::kTria();
    std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
              (&local_468,&local_47b,&local_2a0);
    local_47c = lf::base::RefEl::kQuad();
    std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
              (&local_460,&local_47c,&local_2f0);
    local_458 = &local_478;
    local_450 = 4;
    std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::allocator(&local_47e);
    __l._M_len = local_450;
    __l._M_array = local_458;
    std::
    map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::map(&local_448,__l,&local_47d,&local_47e);
    lf::assemble::UniformFEDofHandler::UniformFEDofHandler
              ((UniformFEDofHandler *)local_408,&local_418,&local_448,true);
    std::
    map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::~map(&local_448);
    std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::~allocator(&local_47e);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_418);
    lf::assemble::PrintInfo((ostream *)&std::cout,(DofHandler *)local_408,0x1e);
    lf::assemble::UniformFEDofHandler::~UniformFEDofHandler((UniformFEDofHandler *)local_408);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<lf::mesh::Mesh> *)&dof_handler.num_loc_dof_quad_);
  }
  else {
    poVar4 = boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_98);
    std::operator<<(poVar4,'\n');
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_188);
  boost::program_options::options_description::~options_description((options_description *)local_98)
  ;
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  // The following code is modeled after the example from
  // https://theboostcpplibraries.com/boost.program_options
  // and defines allowed command line arguments:
  namespace po = boost::program_options;
  po::options_description desc("Allowed options");
  // clang-format off
  desc.add_options()
  ("help,h", "--ndof_node <N> --ndof_edge <N> --ndof_tria <N> --ndof_quad <N>")
  ("ndof_node,n", po::value<int>()->default_value(1), "No of dofs on nodes")
  ("ndof_edge,e", po::value<int>()->default_value(2), "No of dofs on edges")
  ("ndof_tria,t", po::value<int>()->default_value(1), "No of dofs on triangles")
  ("ndof_quad,q", po::value<int>()->default_value(4), "Mp of dofs on quadrilaterals");
  // clang-format on
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  if (vm.count("help") > 0) {
    std::cout << desc << '\n';
  } else {
    // Retrieve number of degrees of freedom for each entity type from command
    // line arguments
    lf::base::size_type ndof_node = 1;
    if (vm.count("ndof_node") > 0) {
      ndof_node = vm["ndof_node"].as<int>();
    }
    lf::base::size_type ndof_edge = 2;
    if (vm.count("ndof_edge") > 0) {
      ndof_edge = vm["ndof_edge"].as<int>();
    }
    lf::base::size_type ndof_tria = 1;
    if (vm.count("ndof_tria") > 0) {
      ndof_tria = vm["ndof_tria"].as<int>();
    }
    lf::base::size_type ndof_quad = 4;
    if (vm.count("ndof_quad") > 0) {
      ndof_quad = vm["ndof_quad"].as<int>();
    }
    std::cout << "LehrFEM++ demo: assignment of global shape functions" << '\n';
    std::cout << "#dof/vertex = " << ndof_node << '\n';
    std::cout << "#dof/edge = " << ndof_edge << '\n';
    std::cout << "#dof/triangle = " << ndof_tria << '\n';
    std::cout << "#dof/quadrilateral = " << ndof_quad << '\n';

    // Build a mesh comprising two cells
    const std::shared_ptr<lf::mesh::Mesh> mesh_p =
        lf::mesh::test_utils::GenerateHybrid2DTestMesh(2);
    // Output information about the mesh
    lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

    // Create a dof handler object describing a uniform distribution
    // of shape functions
    const lf::assemble::UniformFEDofHandler dof_handler(
        mesh_p, {{lf::base::RefEl::kPoint(), ndof_node},
                 {lf::base::RefEl::kSegment(), ndof_edge},
                 {lf::base::RefEl::kTria(), ndof_tria},
                 {lf::base::RefEl::kQuad(), ndof_quad}});
    // Copious output of information about dof handler
    PrintInfo(std::cout, dof_handler, 30);
  }
  return 0L;
}